

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::addClause(SAT *this,vec<Lit> *ps,bool one_watch)

{
  char cVar1;
  uint uVar2;
  Lit *pLVar3;
  char *pcVar4;
  lbool lVar5;
  lbool lVar6;
  uint uVar7;
  Clause *this_00;
  long lVar8;
  char cVar9;
  ulong uVar10;
  
  lVar6.value = ::l_Undef.value;
  lVar5.value = ::l_True.value;
  if (ps->sz == 0) {
    uVar7 = 0;
  }
  else {
    pLVar3 = ps->data;
    pcVar4 = (this->assigns).data;
    lVar8 = 0;
    uVar7 = 0;
    do {
      uVar2 = pLVar3[lVar8].x;
      cVar1 = pcVar4[(uint)((int)uVar2 >> 1)];
      cVar9 = -cVar1;
      if ((uVar2 & 1) == 0) {
        cVar9 = cVar1;
      }
      if (cVar9 == lVar5.value) {
        return;
      }
      if (cVar9 == lVar6.value) {
        uVar10 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        pLVar3[uVar10].x = uVar2;
      }
      lVar8 = lVar8 + 1;
    } while ((uint)lVar8 < ps->sz);
  }
  ps->sz = uVar7;
  if (uVar7 == 0) {
    puts("=====UNSATISFIABLE=====");
    printf("%% Top level failure!\n");
    exit(0);
  }
  this_00 = (Clause *)malloc((ulong)(uVar7 - 1) * 4 + 8);
  Clause::Clause<vec<Lit>>(this_00,ps,false);
  addClause(this,this_00,one_watch);
  return;
}

Assistant:

void SAT::addClause(vec<Lit>& ps, bool one_watch) {
	unsigned int i;
	unsigned int j;
	for (i = j = 0; i < ps.size(); i++) {
		if (value(ps[i]) == l_True) {
			return;
		}
		if (value(ps[i]) == l_Undef) {
			ps[j++] = ps[i];
		}
	}
	ps.resize(j);
	if (ps.size() == 0) {
		assert(false);
		TL_FAIL();
	}
	addClause(*Clause_new(ps), one_watch);
}